

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

Mio_Pin_t * Mio_PinDup(Mio_Pin_t *pPin)

{
  Mio_Pin_t *__dest;
  char *local_20;
  Mio_Pin_t *pPinNew;
  Mio_Pin_t *pPin_local;
  
  __dest = (Mio_Pin_t *)malloc(0x50);
  memcpy(__dest,pPin,0x50);
  if (__dest->pName == (char *)0x0) {
    local_20 = (char *)0x0;
  }
  else {
    local_20 = Abc_UtilStrsav(__dest->pName);
  }
  __dest->pName = local_20;
  __dest->pNext = (Mio_Pin_t *)0x0;
  return __dest;
}

Assistant:

Mio_Pin_t * Mio_PinDup( Mio_Pin_t * pPin )
{
    Mio_Pin_t * pPinNew;

    pPinNew = ABC_ALLOC( Mio_Pin_t, 1 );
    *pPinNew = *pPin;
    pPinNew->pName = (pPinNew->pName ? Abc_UtilStrsav(pPinNew->pName) : NULL);
    pPinNew->pNext = NULL;

    return pPinNew;
}